

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginComboPreview(void)

{
  float *pfVar1;
  ImGuiComboPreviewData *clip_rect_min;
  ImVec2 *clip_rect_max;
  float fVar2;
  ImVec2 IVar3;
  ImGuiWindow *pIVar4;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  float fVar7;
  float fVar8;
  
  pIVar6 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  if ((((pIVar4->SkipItems == false) && (((GImGui->LastItemData).StatusFlags & 0x100) != 0)) &&
      (fVar8 = (GImGui->ComboPreviewData).PreviewRect.Min.y, fVar8 < (pIVar4->ClipRect).Max.y)) &&
     (fVar7 = (GImGui->ComboPreviewData).PreviewRect.Max.y, pfVar1 = &(pIVar4->ClipRect).Min.y,
     *pfVar1 <= fVar7 && fVar7 != *pfVar1)) {
    clip_rect_min = &GImGui->ComboPreviewData;
    fVar7 = (clip_rect_min->PreviewRect).Min.x;
    if ((fVar7 < (pIVar4->ClipRect).Max.x) &&
       (clip_rect_max = &(GImGui->ComboPreviewData).PreviewRect.Max, fVar2 = clip_rect_max->x,
       (pIVar4->ClipRect).Min.x <= fVar2 && fVar2 != (pIVar4->ClipRect).Min.x)) {
      (GImGui->ComboPreviewData).BackupCursorPos = (pIVar4->DC).CursorPos;
      (pIVar6->ComboPreviewData).BackupCursorMaxPos = (pIVar4->DC).CursorMaxPos;
      (pIVar6->ComboPreviewData).BackupCursorPosPrevLine = (pIVar4->DC).CursorPosPrevLine;
      (pIVar6->ComboPreviewData).BackupPrevLineTextBaseOffset = (pIVar4->DC).PrevLineTextBaseOffset;
      (pIVar6->ComboPreviewData).BackupLayout = (pIVar4->DC).LayoutType;
      IVar3 = (pIVar6->Style).FramePadding;
      fVar7 = fVar7 + IVar3.x;
      fVar8 = fVar8 + IVar3.y;
      IVar3.y = fVar8;
      IVar3.x = fVar7;
      (pIVar4->DC).CursorPos = IVar3;
      IVar5.y = fVar8;
      IVar5.x = fVar7;
      (pIVar4->DC).CursorMaxPos = IVar5;
      (pIVar4->DC).LayoutType = 0;
      (pIVar4->DC).IsSameLine = false;
      PushClipRect((ImVec2 *)clip_rect_min,clip_rect_max,true);
      return true;
    }
  }
  return false;
}

Assistant:

bool ImGui::BeginComboPreview()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiComboPreviewData* preview_data = &g.ComboPreviewData;

    if (window->SkipItems || !(g.LastItemData.StatusFlags & ImGuiItemStatusFlags_Visible))
        return false;
    IM_ASSERT(g.LastItemData.Rect.Min.x == preview_data->PreviewRect.Min.x && g.LastItemData.Rect.Min.y == preview_data->PreviewRect.Min.y); // Didn't call after BeginCombo/EndCombo block or forgot to pass ImGuiComboFlags_CustomPreview flag?
    if (!window->ClipRect.Overlaps(preview_data->PreviewRect)) // Narrower test (optional)
        return false;

    // FIXME: This could be contained in a PushWorkRect() api
    preview_data->BackupCursorPos = window->DC.CursorPos;
    preview_data->BackupCursorMaxPos = window->DC.CursorMaxPos;
    preview_data->BackupCursorPosPrevLine = window->DC.CursorPosPrevLine;
    preview_data->BackupPrevLineTextBaseOffset = window->DC.PrevLineTextBaseOffset;
    preview_data->BackupLayout = window->DC.LayoutType;
    window->DC.CursorPos = preview_data->PreviewRect.Min + g.Style.FramePadding;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.LayoutType = ImGuiLayoutType_Horizontal;
    window->DC.IsSameLine = false;
    PushClipRect(preview_data->PreviewRect.Min, preview_data->PreviewRect.Max, true);

    return true;
}